

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utglTF2ImportExport.cpp
# Opt level: O0

void __thiscall
utglTF2ImportExport_importglTF2PrimitiveModeTrianglesWithoutIndices_Test::TestBody
          (utglTF2ImportExport_importglTF2PrimitiveModeTrianglesWithoutIndices_Test *this)

{
  uint *puVar1;
  bool bVar2;
  char *pcVar3;
  reference pvVar4;
  AssertHelper local_168;
  Message local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_6;
  size_t i_1;
  Message local_138;
  uint local_12c;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_5;
  array<unsigned_int,_3UL> f2;
  Message local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_4;
  size_t i;
  Message local_d8;
  uint local_cc;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_3;
  array<unsigned_int,_3UL> f1;
  Message local_a0;
  uint local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_2;
  Message local_78;
  uint local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar_1;
  Message local_50;
  void *local_48;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  aiScene *local_20;
  aiScene *scene;
  Importer importer;
  utglTF2ImportExport_importglTF2PrimitiveModeTrianglesWithoutIndices_Test *this_local;
  
  importer.pimpl = (ImporterPimpl *)this;
  Assimp::Importer::Importer((Importer *)&scene);
  local_20 = Assimp::Importer::ReadFile
                       ((Importer *)&scene,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/glTF2/glTF-Asset-Generator/Mesh_PrimitiveMode/Mesh_PrimitiveMode_06.gltf"
                        ,0x400);
  local_48 = (void *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)local_40,"nullptr","scene",&local_48,&local_20);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar2) {
    testing::Message::Message(&local_50);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utglTF2ImportExport.cpp"
               ,0xe6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_50);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  local_6c = 2;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_68,"scene->mMeshes[0]->mNumFaces","2u",
             &(*local_20->mMeshes)->mNumFaces,&local_6c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar2) {
    testing::Message::Message(&local_78);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utglTF2ImportExport.cpp"
               ,0xe7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  local_94 = 6;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_90,"scene->mMeshes[0]->mNumVertices","6u",
             &(*local_20->mMeshes)->mNumVertices,&local_94);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
  if (!bVar2) {
    testing::Message::Message(&local_a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(f1._M_elems + 2),kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utglTF2ImportExport.cpp"
               ,0xe8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)(f1._M_elems + 2),&local_a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(f1._M_elems + 2));
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
  gtest_ar_3.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x100000000;
  f1._M_elems[0] = 2;
  local_cc = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_c8,"scene->mMeshes[0]->mFaces[0].mNumIndices","3u",
             &(*local_20->mMeshes)->mFaces->mNumIndices,&local_cc);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
  if (!bVar2) {
    testing::Message::Message(&local_d8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utglTF2ImportExport.cpp"
               ,0xea,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i,&local_d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i);
    testing::Message::~Message(&local_d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
  for (gtest_ar_4.message_.ptr_ =
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      gtest_ar_4.message_.ptr_ <
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
      gtest_ar_4.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &(gtest_ar_4.message_.ptr_)->field_0x1) {
    puVar1 = (*local_20->mMeshes)->mFaces->mIndices + (long)gtest_ar_4.message_.ptr_;
    pvVar4 = std::array<unsigned_int,_3UL>::operator[]
                       ((array<unsigned_int,_3UL> *)&gtest_ar_3.message_,
                        (size_type)gtest_ar_4.message_.ptr_);
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((EqHelper<false> *)local_f8,"scene->mMeshes[0]->mFaces[0].mIndices[i]","f1[i]",puVar1
               ,pvVar4);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
    if (!bVar2) {
      testing::Message::Message(&local_100);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)(f2._M_elems + 2),kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utglTF2ImportExport.cpp"
                 ,0xec,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)(f2._M_elems + 2),&local_100);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(f2._M_elems + 2));
      testing::Message::~Message(&local_100);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  }
  gtest_ar_5.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x400000003;
  f2._M_elems[0] = 5;
  local_12c = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_128,"scene->mMeshes[0]->mFaces[1].mNumIndices","3u",
             &(*local_20->mMeshes)->mFaces[1].mNumIndices,&local_12c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar2) {
    testing::Message::Message(&local_138);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&i_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utglTF2ImportExport.cpp"
               ,0xf0,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&i_1,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_1);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  for (gtest_ar_6.message_.ptr_ =
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      gtest_ar_6.message_.ptr_ <
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
      gtest_ar_6.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           &(gtest_ar_6.message_.ptr_)->field_0x1) {
    puVar1 = (*local_20->mMeshes)->mFaces[1].mIndices + (long)gtest_ar_6.message_.ptr_;
    pvVar4 = std::array<unsigned_int,_3UL>::operator[]
                       ((array<unsigned_int,_3UL> *)&gtest_ar_5.message_,
                        (size_type)gtest_ar_6.message_.ptr_);
    testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
              ((EqHelper<false> *)local_158,"scene->mMeshes[0]->mFaces[1].mIndices[i]","f2[i]",
               puVar1,pvVar4);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
    if (!bVar2) {
      testing::Message::Message(&local_160);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
      testing::internal::AssertHelper::AssertHelper
                (&local_168,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utglTF2ImportExport.cpp"
                 ,0xf2,pcVar3);
      testing::internal::AssertHelper::operator=(&local_168,&local_160);
      testing::internal::AssertHelper::~AssertHelper(&local_168);
      testing::Message::~Message(&local_160);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  }
  Assimp::Importer::~Importer((Importer *)&scene);
  return;
}

Assistant:

TEST_F(utglTF2ImportExport, importglTF2PrimitiveModeTrianglesWithoutIndices) {
    Assimp::Importer importer;
    //Triangles without indices
    const aiScene *scene = importer.ReadFile(ASSIMP_TEST_MODELS_DIR "/glTF2/glTF-Asset-Generator/Mesh_PrimitiveMode/Mesh_PrimitiveMode_06.gltf", aiProcess_ValidateDataStructure);
    EXPECT_NE(nullptr, scene);
    EXPECT_EQ(scene->mMeshes[0]->mNumFaces, 2u);
    EXPECT_EQ(scene->mMeshes[0]->mNumVertices, 6u);
    std::array<unsigned int, 3> f1 = {{ 0u, 1u, 2u }};
    EXPECT_EQ(scene->mMeshes[0]->mFaces[0].mNumIndices, 3u);
    for (size_t i = 0; i < 3; ++i) {
        EXPECT_EQ(scene->mMeshes[0]->mFaces[0].mIndices[i], f1[i]);
    }

    std::array<unsigned int, 3> f2 = {{ 3u, 4u, 5u }};
    EXPECT_EQ(scene->mMeshes[0]->mFaces[1].mNumIndices, 3u);
    for (size_t i = 0; i < 3; ++i) {
        EXPECT_EQ(scene->mMeshes[0]->mFaces[1].mIndices[i], f2[i]);
    }
}